

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  undefined1 local_58 [8];
  string part;
  
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    while( true ) {
      std::__cxx11::string::string
                ((string *)local_58,".",(allocator *)(part.field_2._M_local_buf + 0xf));
      bVar1 = TryConsume(this,(string *)local_58);
      std::__cxx11::string::~string((string *)local_58);
      if (!bVar1) break;
      local_58 = (undefined1  [8])&part._M_string_length;
      part._M_dataplus._M_p = (pointer)0x0;
      part._M_string_length._0_1_ = 0;
      bVar1 = ConsumeIdentifier(this,(string *)local_58);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)local_58);
        goto LAB_0031635a;
      }
      std::__cxx11::string::append((char *)name);
      std::__cxx11::string::append((string *)name);
      std::__cxx11::string::~string((string *)local_58);
    }
    bVar1 = true;
  }
  else {
LAB_0031635a:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += ".";
      *name += part;
    }
    return true;
  }